

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeText.Common.cpp
# Opt level: O3

int PlatformAgnostic::UnicodeText::Internal::readNumber<char16_t_const>(char16_t **str)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  char16_t *pcVar5;
  char16_t cVar6;
  int iVar7;
  
  pcVar5 = *str;
  cVar6 = *pcVar5;
  iVar3 = 0;
  if ((ushort)(cVar6 + L'￐') < 10) {
    iVar7 = 0;
    do {
      pcVar5 = pcVar5 + 1;
      iVar3 = (uint)(ushort)cVar6 + iVar7 * 10 + -0x30;
      if (iVar3 <= iVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/UnicodeText.Common.cpp"
                           ,0x3d,"(newNum > num)","newNum > num");
        if (bVar2) {
          *puVar4 = 0;
          return iVar7;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *str = pcVar5;
      cVar6 = *pcVar5;
      iVar7 = iVar3;
    } while ((ushort)(cVar6 + L'￐') < 10);
  }
  return iVar3;
}

Assistant:

int readNumber(__inout CharType* &str)
            {
                int num = 0;

                // Count digits on each string
                while (isDigit(*str))
                {
                    int newNum = (num * 10) + (*str - '0');
                    Assert(newNum > num);
                    if (newNum <= num)
                    {
                        return num;
                    }

                    num = newNum;

                    str++;
                }

                return num;
            }